

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_sse4.c
# Opt level: O2

void dr_prediction_z1_32xN_sse4_1
               (int N,uint8_t *dst,ptrdiff_t stride,uint8_t *above,int upsample_above,int dx)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  ulong uVar3;
  long lVar4;
  undefined8 *puVar5;
  int iVar6;
  uint8_t *puVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  uint uVar11;
  uint uVar12;
  ulong uVar13;
  uint uVar14;
  bool bVar15;
  short sVar16;
  short sVar18;
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 in_XMM3 [16];
  undefined1 auVar20 [16];
  ushort uVar21;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  ushort uVar30;
  ushort uVar31;
  ushort uVar33;
  ushort uVar34;
  ushort uVar35;
  ushort uVar36;
  ushort uVar37;
  ushort uVar38;
  ushort uVar39;
  undefined1 auVar32 [16];
  undefined1 in_XMM7 [16];
  undefined1 auVar40 [16];
  __m128i dstvec [64];
  undefined1 local_858 [16];
  undefined1 local_848 [16];
  undefined8 local_838 [128];
  undefined8 local_438 [129];
  
  auVar19 = pshufb(ZEXT116(above[(long)N + 0x1f]),(undefined1  [16])0x0);
  uVar8 = 0;
  uVar3 = 0;
  if (0 < N) {
    uVar3 = (ulong)(uint)N;
  }
  uVar9 = (ulong)(uint)N;
  puVar10 = local_438;
  puVar5 = local_838;
  auVar20 = pmovsxbw(in_XMM3,0x1010101010101010);
  uVar14 = upsample_above;
  do {
    if (uVar8 == uVar3) break;
    iVar6 = (int)uVar14 >> 6;
    uVar11 = (N + 0x1f) - iVar6;
    if (uVar11 == 0 || N + 0x1f < iVar6) {
      lVar4 = 0;
      uVar13 = uVar9;
      while (bVar15 = uVar13 != 0, uVar13 = uVar13 - 1, bVar15) {
        *(undefined1 (*) [16])((long)puVar10 + lVar4) = auVar19;
        *(undefined1 (*) [16])((long)puVar5 + lVar4) = auVar19;
        lVar4 = lVar4 + 0x10;
      }
    }
    else {
      auVar17 = ZEXT416(uVar14 >> 1 & 0x1f);
      auVar17 = pshuflw(auVar17,auVar17,0);
      for (uVar13 = 0; uVar13 != 0x20; uVar13 = uVar13 + 0x10) {
        auVar32 = auVar19;
        if (uVar13 < uVar11) {
          auVar32 = *(undefined1 (*) [16])(above + uVar13 + (long)iVar6);
          auVar1 = *(undefined1 (*) [16])(above + uVar13 + (long)iVar6 + 1);
          auVar22 = pmovzxbw(auVar19,auVar32);
          auVar40 = pmovzxbw(in_XMM7,auVar1);
          auVar23 = psllw(auVar22,5);
          sVar16 = auVar17._0_2_;
          in_XMM7._0_2_ = (auVar40._0_2_ - auVar22._0_2_) * sVar16;
          sVar18 = auVar17._2_2_;
          in_XMM7._2_2_ = (auVar40._2_2_ - auVar22._2_2_) * sVar18;
          in_XMM7._4_2_ = (auVar40._4_2_ - auVar22._4_2_) * sVar16;
          in_XMM7._6_2_ = (auVar40._6_2_ - auVar22._6_2_) * sVar18;
          in_XMM7._8_2_ = (auVar40._8_2_ - auVar22._8_2_) * sVar16;
          in_XMM7._10_2_ = (auVar40._10_2_ - auVar22._10_2_) * sVar18;
          in_XMM7._12_2_ = (auVar40._12_2_ - auVar22._12_2_) * sVar16;
          in_XMM7._14_2_ = (auVar40._14_2_ - auVar22._14_2_) * sVar18;
          uVar21 = (ushort)(auVar23._0_2_ + auVar20._0_2_ + in_XMM7._0_2_) >> 5;
          uVar24 = (ushort)(auVar23._2_2_ + auVar20._2_2_ + in_XMM7._2_2_) >> 5;
          uVar25 = (ushort)(auVar23._4_2_ + auVar20._4_2_ + in_XMM7._4_2_) >> 5;
          uVar26 = (ushort)(auVar23._6_2_ + auVar20._6_2_ + in_XMM7._6_2_) >> 5;
          uVar27 = (ushort)(auVar23._8_2_ + auVar20._8_2_ + in_XMM7._8_2_) >> 5;
          uVar28 = (ushort)(auVar23._10_2_ + auVar20._10_2_ + in_XMM7._10_2_) >> 5;
          uVar29 = (ushort)(auVar23._12_2_ + auVar20._12_2_ + in_XMM7._12_2_) >> 5;
          uVar30 = (ushort)(auVar23._14_2_ + auVar20._14_2_ + in_XMM7._14_2_) >> 5;
          auVar22._0_2_ = CONCAT11(0,auVar32[8]);
          auVar22[2] = auVar32[9];
          auVar22[3] = 0;
          auVar22[4] = auVar32[10];
          auVar22[5] = 0;
          auVar22[6] = auVar32[0xb];
          auVar22[7] = 0;
          auVar22[8] = auVar32[0xc];
          auVar22[9] = 0;
          auVar22[10] = auVar32[0xd];
          auVar22[0xb] = 0;
          auVar22[0xc] = auVar32[0xe];
          auVar22[0xd] = 0;
          auVar22[0xe] = auVar32[0xf];
          auVar22[0xf] = 0;
          auVar23 = psllw(auVar22,5);
          uVar31 = (ushort)(auVar23._0_2_ + auVar20._0_2_ + (auVar1[8] - auVar22._0_2_) * sVar16) >>
                   5;
          uVar33 = (ushort)(auVar23._2_2_ + auVar20._2_2_ +
                           ((ushort)auVar1[9] - (ushort)auVar32[9]) * sVar18) >> 5;
          uVar34 = (ushort)(auVar23._4_2_ + auVar20._4_2_ +
                           ((ushort)auVar1[10] - (ushort)auVar32[10]) * sVar16) >> 5;
          uVar35 = (ushort)(auVar23._6_2_ + auVar20._6_2_ +
                           ((ushort)auVar1[0xb] - (ushort)auVar32[0xb]) * sVar18) >> 5;
          uVar36 = (ushort)(auVar23._8_2_ + auVar20._8_2_ +
                           ((ushort)auVar1[0xc] - (ushort)auVar32[0xc]) * sVar16) >> 5;
          uVar37 = (ushort)(auVar23._10_2_ + auVar20._10_2_ +
                           ((ushort)auVar1[0xd] - (ushort)auVar32[0xd]) * sVar18) >> 5;
          uVar38 = (ushort)(auVar23._12_2_ + auVar20._12_2_ +
                           ((ushort)auVar1[0xe] - (ushort)auVar32[0xe]) * sVar16) >> 5;
          uVar39 = (ushort)(auVar23._14_2_ + auVar20._14_2_ +
                           ((ushort)auVar1[0xf] - (ushort)auVar32[0xf]) * sVar18) >> 5;
          auVar32[1] = (uVar24 != 0) * (uVar24 < 0x100) * (char)uVar24 - (0xff < uVar24);
          auVar32[0] = (uVar21 != 0) * (uVar21 < 0x100) * (char)uVar21 - (0xff < uVar21);
          auVar32[2] = (uVar25 != 0) * (uVar25 < 0x100) * (char)uVar25 - (0xff < uVar25);
          auVar32[3] = (uVar26 != 0) * (uVar26 < 0x100) * (char)uVar26 - (0xff < uVar26);
          auVar32[4] = (uVar27 != 0) * (uVar27 < 0x100) * (char)uVar27 - (0xff < uVar27);
          auVar32[5] = (uVar28 != 0) * (uVar28 < 0x100) * (char)uVar28 - (0xff < uVar28);
          auVar32[6] = (uVar29 != 0) * (uVar29 < 0x100) * (char)uVar29 - (0xff < uVar29);
          auVar32[7] = (uVar30 != 0) * (uVar30 < 0x100) * (char)uVar30 - (0xff < uVar30);
          auVar32[8] = (uVar31 != 0) * (uVar31 < 0x100) * (char)uVar31 - (0xff < uVar31);
          auVar32[9] = (uVar33 != 0) * (uVar33 < 0x100) * (char)uVar33 - (0xff < uVar33);
          auVar32[10] = (uVar34 != 0) * (uVar34 < 0x100) * (char)uVar34 - (0xff < uVar34);
          auVar32[0xb] = (uVar35 != 0) * (uVar35 < 0x100) * (char)uVar35 - (0xff < uVar35);
          auVar32[0xc] = (uVar36 != 0) * (uVar36 < 0x100) * (char)uVar36 - (0xff < uVar36);
          auVar32[0xd] = (uVar37 != 0) * (uVar37 < 0x100) * (char)uVar37 - (0xff < uVar37);
          auVar32[0xe] = (uVar38 != 0) * (uVar38 < 0x100) * (char)uVar38 - (0xff < uVar38);
          auVar32[0xf] = (uVar39 != 0) * (uVar39 < 0x100) * (char)uVar39 - (0xff < uVar39);
        }
        *(undefined1 (*) [16])(local_858 + uVar13) = auVar32;
      }
      uVar12 = 0x20;
      if (uVar11 < 0x20) {
        uVar12 = uVar11;
      }
      auVar17 = pblendvb(auVar19,local_858,*(undefined1 (*) [16])(Mask[0][0] + (uVar12 << 4)));
      auVar32 = pblendvb(auVar19,local_848,*(undefined1 (*) [16])(Mask[1][0] + (uVar12 << 4)));
      *(undefined1 (*) [16])(local_438 + uVar8 * 2) = auVar17;
      *(undefined1 (*) [16])(local_838 + uVar8 * 2) = auVar32;
      uVar14 = uVar14 + upsample_above;
    }
    uVar8 = uVar8 + 1;
    uVar9 = uVar9 - 1;
    puVar10 = puVar10 + 2;
    puVar5 = puVar5 + 2;
  } while (0 < (int)uVar11);
  puVar7 = dst + 0x10;
  for (lVar4 = 0; uVar3 * 0x10 != lVar4; lVar4 = lVar4 + 0x10) {
    uVar2 = *(undefined8 *)((long)local_438 + lVar4 + 8);
    *(undefined8 *)(puVar7 + -0x10) = *(undefined8 *)((long)local_438 + lVar4);
    *(undefined8 *)(puVar7 + -8) = uVar2;
    uVar2 = *(undefined8 *)((long)local_838 + lVar4 + 8);
    *(undefined8 *)puVar7 = *(undefined8 *)((long)local_838 + lVar4);
    *(undefined8 *)(puVar7 + 8) = uVar2;
    puVar7 = puVar7 + stride;
  }
  return;
}

Assistant:

static AOM_FORCE_INLINE void dr_prediction_z1_32xN_internal_sse4_1(
    int N, __m128i *dstvec, __m128i *dstvec_h, const uint8_t *above,
    int upsample_above, int dx) {
  // here upsample_above is 0 by design of av1_use_intra_edge_upsample
  (void)upsample_above;
  const int frac_bits = 6;
  const int max_base_x = ((32 + N) - 1);

  // pre-filter above pixels
  // store in temp buffers:
  //   above[x] * 32 + 16
  //   above[x+1] - above[x]
  // final pixels will be calculated as:
  //   (above[x] * 32 + 16 + (above[x+1] - above[x]) * shift) >> 5
  __m128i a0, a1, a32, a16;
  __m128i a_mbase_x, diff, c3f;

  a16 = _mm_set1_epi16(16);
  a_mbase_x = _mm_set1_epi8((char)above[max_base_x]);
  c3f = _mm_set1_epi16(0x3f);

  int x = dx;
  for (int r = 0; r < N; r++) {
    __m128i b, res, res1, res16[2];
    __m128i a0_above, a1_above;

    int base = x >> frac_bits;
    int base_max_diff = (max_base_x - base);
    if (base_max_diff <= 0) {
      for (int i = r; i < N; ++i) {
        dstvec[i] = a_mbase_x;  // save 32 values
        dstvec_h[i] = a_mbase_x;
      }
      return;
    }
    if (base_max_diff > 32) base_max_diff = 32;
    __m128i shift = _mm_srli_epi16(_mm_and_si128(_mm_set1_epi16(x), c3f), 1);

    for (int j = 0, jj = 0; j < 32; j += 16, jj++) {
      int mdiff = base_max_diff - j;
      if (mdiff <= 0) {
        res16[jj] = a_mbase_x;
      } else {
        a0_above = _mm_loadu_si128((__m128i *)(above + base + j));
        a1_above = _mm_loadu_si128((__m128i *)(above + base + j + 1));

        // lower half
        a0 = _mm_cvtepu8_epi16(a0_above);
        a1 = _mm_cvtepu8_epi16(a1_above);

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16
        b = _mm_mullo_epi16(diff, shift);

        res = _mm_add_epi16(a32, b);
        res = _mm_srli_epi16(res, 5);

        // uppar half
        a0 = _mm_cvtepu8_epi16(_mm_srli_si128(a0_above, 8));
        a1 = _mm_cvtepu8_epi16(_mm_srli_si128(a1_above, 8));

        diff = _mm_sub_epi16(a1, a0);   // a[x+1] - a[x]
        a32 = _mm_slli_epi16(a0, 5);    // a[x] * 32
        a32 = _mm_add_epi16(a32, a16);  // a[x] * 32 + 16

        b = _mm_mullo_epi16(diff, shift);
        res1 = _mm_add_epi16(a32, b);
        res1 = _mm_srli_epi16(res1, 5);

        res16[jj] = _mm_packus_epi16(res, res1);  // 16 8bit values
      }
    }

    dstvec[r] =
        _mm_blendv_epi8(a_mbase_x, res16[0],
                        *(__m128i *)Mask[0][base_max_diff]);  // 16 8bit values

    dstvec_h[r] =
        _mm_blendv_epi8(a_mbase_x, res16[1],
                        *(__m128i *)Mask[1][base_max_diff]);  // 16 8bit values
    x += dx;
  }
}